

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_constraint.cpp
# Opt level: O3

unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> __thiscall
duckdb::ForeignKeyConstraint::Deserialize(ForeignKeyConstraint *this,Deserializer *deserializer)

{
  ForeignKeyType FVar1;
  int iVar2;
  uint uVar3;
  ForeignKeyConstraint *this_00;
  pointer pFVar4;
  pointer *__ptr;
  string *psVar5;
  string str;
  _Head_base<0UL,_duckdb::ForeignKeyConstraint_*,_false> local_58;
  char *local_50;
  undefined8 local_48;
  char local_40 [16];
  
  this_00 = (ForeignKeyConstraint *)operator_new(0xb8);
  ForeignKeyConstraint(this_00);
  local_58._M_head_impl = this_00;
  pFVar4 = unique_ptr<duckdb::ForeignKeyConstraint,_std::default_delete<duckdb::ForeignKeyConstraint>,_true>
           ::operator->((unique_ptr<duckdb::ForeignKeyConstraint,_std::default_delete<duckdb::ForeignKeyConstraint>,_true>
                         *)&local_58);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (deserializer,200,"pk_columns",&pFVar4->pk_columns);
  pFVar4 = unique_ptr<duckdb::ForeignKeyConstraint,_std::default_delete<duckdb::ForeignKeyConstraint>,_true>
           ::operator->((unique_ptr<duckdb::ForeignKeyConstraint,_std::default_delete<duckdb::ForeignKeyConstraint>,_true>
                         *)&local_58);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (deserializer,0xc9,"fk_columns",&pFVar4->fk_columns);
  pFVar4 = unique_ptr<duckdb::ForeignKeyConstraint,_std::default_delete<duckdb::ForeignKeyConstraint>,_true>
           ::operator->((unique_ptr<duckdb::ForeignKeyConstraint,_std::default_delete<duckdb::ForeignKeyConstraint>,_true>
                         *)&local_58);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0xca,"fk_type");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    FVar1 = EnumUtil::FromString<duckdb::ForeignKeyType>(local_50);
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
  }
  else {
    iVar2 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
    FVar1 = (ForeignKeyType)iVar2;
  }
  (pFVar4->info).type = FVar1;
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  pFVar4 = unique_ptr<duckdb::ForeignKeyConstraint,_std::default_delete<duckdb::ForeignKeyConstraint>,_true>
           ::operator->((unique_ptr<duckdb::ForeignKeyConstraint,_std::default_delete<duckdb::ForeignKeyConstraint>,_true>
                         *)&local_58);
  uVar3 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xcb,"schema");
  psVar5 = &(pFVar4->info).schema;
  if ((char)uVar3 == '\0') {
    local_48 = 0;
    local_40[0] = '\0';
    local_50 = local_40;
    ::std::__cxx11::string::operator=((string *)psVar5,(string *)&local_50);
    if (local_50 != local_40) goto LAB_017370ab;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)psVar5,(string *)&local_50);
    if (local_50 != local_40) {
LAB_017370ab:
      operator_delete(local_50);
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar3 & 0xff));
  pFVar4 = unique_ptr<duckdb::ForeignKeyConstraint,_std::default_delete<duckdb::ForeignKeyConstraint>,_true>
           ::operator->((unique_ptr<duckdb::ForeignKeyConstraint,_std::default_delete<duckdb::ForeignKeyConstraint>,_true>
                         *)&local_58);
  uVar3 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xcc,"table");
  psVar5 = &(pFVar4->info).table;
  if ((char)uVar3 == '\0') {
    local_48 = 0;
    local_40[0] = '\0';
    local_50 = local_40;
    ::std::__cxx11::string::operator=((string *)psVar5,(string *)&local_50);
    if (local_50 == local_40) goto LAB_0173714c;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)psVar5,(string *)&local_50);
    if (local_50 == local_40) goto LAB_0173714c;
  }
  operator_delete(local_50);
LAB_0173714c:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar3 & 0xff));
  pFVar4 = unique_ptr<duckdb::ForeignKeyConstraint,_std::default_delete<duckdb::ForeignKeyConstraint>,_true>
           ::operator->((unique_ptr<duckdb::ForeignKeyConstraint,_std::default_delete<duckdb::ForeignKeyConstraint>,_true>
                         *)&local_58);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::PhysicalIndex,true>>
            (deserializer,0xcd,"pk_keys",&(pFVar4->info).pk_keys);
  pFVar4 = unique_ptr<duckdb::ForeignKeyConstraint,_std::default_delete<duckdb::ForeignKeyConstraint>,_true>
           ::operator->((unique_ptr<duckdb::ForeignKeyConstraint,_std::default_delete<duckdb::ForeignKeyConstraint>,_true>
                         *)&local_58);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::PhysicalIndex,true>>
            (deserializer,0xce,"fk_keys",&(pFVar4->info).fk_keys);
  (this->super_Constraint)._vptr_Constraint = (_func_int **)local_58._M_head_impl;
  return (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>_>)
         (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>_>)this;
}

Assistant:

unique_ptr<Constraint> ForeignKeyConstraint::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<ForeignKeyConstraint>(new ForeignKeyConstraint());
	deserializer.ReadPropertyWithDefault<vector<string>>(200, "pk_columns", result->pk_columns);
	deserializer.ReadPropertyWithDefault<vector<string>>(201, "fk_columns", result->fk_columns);
	deserializer.ReadProperty<ForeignKeyType>(202, "fk_type", result->info.type);
	deserializer.ReadPropertyWithDefault<string>(203, "schema", result->info.schema);
	deserializer.ReadPropertyWithDefault<string>(204, "table", result->info.table);
	deserializer.ReadPropertyWithDefault<vector<PhysicalIndex>>(205, "pk_keys", result->info.pk_keys);
	deserializer.ReadPropertyWithDefault<vector<PhysicalIndex>>(206, "fk_keys", result->info.fk_keys);
	return std::move(result);
}